

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.cpp
# Opt level: O2

bool __thiscall spvtools::opt::SSAPropagator::Simulate(SSAPropagator *this,Instruction *instr)

{
  pointer pEVar1;
  bool bVar2;
  PropStatus status;
  uint uVar3;
  uint32_t id;
  mapped_type *pmVar4;
  BasicBlock *b1;
  DefUseManager *this_00;
  Instruction *instr_00;
  Edge *e;
  pointer edge;
  uint index;
  bool bVar5;
  BasicBlock *dest_bb;
  BasicBlock *block;
  undefined8 local_48;
  _Manager_type local_40;
  code *local_38;
  
  bVar2 = ShouldSimulateAgain(this,instr);
  if (bVar2) {
    dest_bb = (BasicBlock *)0x0;
    status = std::
             function<spvtools::opt::SSAPropagator::PropStatus_(spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_**)>
             ::operator()(&this->visit_fn_,instr,&dest_bb);
    bVar2 = SetStatus(this,instr,status);
    if (status != kVarying) {
      bVar5 = status == kInteresting;
      if (bVar5) {
        if (bVar2) {
          AddSSAEdges(this,instr);
        }
        if (dest_bb != (BasicBlock *)0x0) {
          b1 = IRContext::get_instr_block(this->ctx_,instr);
          Edge::Edge((Edge *)&block,b1,dest_bb);
          AddControlEdge(this,(Edge *)&block);
        }
      }
      if (instr->opcode_ == OpPhi) {
        index = 2;
        while (uVar3 = (uint)(((long)(instr->operands_).
                                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(instr->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x30),
              index < uVar3) {
          if (uVar3 - 1 <= index) {
            __assert_fail("i % 2 == 0 && i < instr->NumOperands() - 1 && \"malformed Phi arguments\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/propagator.cpp"
                          ,0x91,"bool spvtools::opt::SSAPropagator::Simulate(Instruction *)");
          }
          id = Instruction::GetSingleWordOperand(instr,index);
          this_00 = get_def_use_mgr(this);
          instr_00 = analysis::DefUseManager::GetDef(this_00,id);
          bVar2 = IsPhiArgExecutable(this,instr,index);
          if (!bVar2) {
            return bVar5;
          }
          bVar2 = ShouldSimulateAgain(this,instr_00);
          index = index + 2;
          if (bVar2) {
            return bVar5;
          }
        }
      }
      else {
        local_48 = (BasicBlock *)0x0;
        local_38 = std::
                   _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/propagator.cpp:159:31)>
                   ::_M_invoke;
        local_40 = std::
                   _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/propagator.cpp:159:31)>
                   ::_M_manager;
        block = (BasicBlock *)this;
        bVar2 = Instruction::WhileEachInId(instr,(function<bool_(unsigned_int_*)> *)&block);
        if (local_40 != (_Manager_type)0x0) {
          (*local_40)((_Any_data *)&block,(_Any_data *)&block,__destroy_functor);
        }
        if (!bVar2) {
          return bVar5;
        }
      }
      DontSimulateAgain(this,instr);
      return bVar5;
    }
    DontSimulateAgain(this,instr);
    if (bVar2) {
      AddSSAEdges(this,instr);
    }
    bVar2 = Instruction::IsBlockTerminator(instr);
    if (bVar2) {
      block = IRContext::get_instr_block(this->ctx_,instr);
      pmVar4 = std::__detail::
               _Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->bb_succs_,&block);
      pEVar1 = (pmVar4->
               super__Vector_base<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      for (edge = (pmVar4->
                  super__Vector_base<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>).
                  _M_impl.super__Vector_impl_data._M_start; edge != pEVar1; edge = edge + 1) {
        AddControlEdge(this,edge);
      }
    }
  }
  return false;
}

Assistant:

bool SSAPropagator::Simulate(Instruction* instr) {
  bool changed = false;

  // Don't bother visiting instructions that should not be simulated again.
  if (!ShouldSimulateAgain(instr)) {
    return changed;
  }

  BasicBlock* dest_bb = nullptr;
  PropStatus status = visit_fn_(instr, &dest_bb);
  bool status_changed = SetStatus(instr, status);

  if (status == kVarying) {
    // The statement produces a varying result, add it to the list of statements
    // not to simulate anymore and add its SSA def-use edges for simulation.
    DontSimulateAgain(instr);
    if (status_changed) {
      AddSSAEdges(instr);
    }

    // If |instr| is a block terminator, add all the control edges out of its
    // block.
    if (instr->IsBlockTerminator()) {
      BasicBlock* block = ctx_->get_instr_block(instr);
      for (const auto& e : bb_succs_.at(block)) {
        AddControlEdge(e);
      }
    }
    return false;
  } else if (status == kInteresting) {
    // Add the SSA edges coming out of this instruction if the propagation
    // status has changed.
    if (status_changed) {
      AddSSAEdges(instr);
    }

    // If there are multiple outgoing control flow edges and we know which one
    // will be taken, add the destination block to the CFG work list.
    if (dest_bb) {
      AddControlEdge(Edge(ctx_->get_instr_block(instr), dest_bb));
    }
    changed = true;
  }

  // At this point, we are dealing with instructions that are in status
  // kInteresting or kNotInteresting.  To decide whether this instruction should
  // be simulated again, we examine its operands.  If at least one operand O is
  // defined at an instruction D that should be simulated again, then the output
  // of D might affect |instr|, so we should simulate |instr| again.
  bool has_operands_to_simulate = false;
  if (instr->opcode() == spv::Op::OpPhi) {
    // For Phi instructions, an operand causes the Phi to be simulated again if
    // the operand comes from an edge that has not yet been traversed or if its
    // definition should be simulated again.
    for (uint32_t i = 2; i < instr->NumOperands(); i += 2) {
      // Phi arguments come in pairs. Index 'i' contains the
      // variable id, index 'i + 1' is the originating block id.
      assert(i % 2 == 0 && i < instr->NumOperands() - 1 &&
             "malformed Phi arguments");

      uint32_t arg_id = instr->GetSingleWordOperand(i);
      Instruction* arg_def_instr = get_def_use_mgr()->GetDef(arg_id);
      if (!IsPhiArgExecutable(instr, i) || ShouldSimulateAgain(arg_def_instr)) {
        has_operands_to_simulate = true;
        break;
      }
    }
  } else {
    // For regular instructions, check if the defining instruction of each
    // operand needs to be simulated again.  If so, then this instruction should
    // also be simulated again.
    has_operands_to_simulate =
        !instr->WhileEachInId([this](const uint32_t* use) {
          Instruction* def_instr = get_def_use_mgr()->GetDef(*use);
          if (ShouldSimulateAgain(def_instr)) {
            return false;
          }
          return true;
        });
  }

  if (!has_operands_to_simulate) {
    DontSimulateAgain(instr);
  }

  return changed;
}